

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall
fmp4_stream::ingest_stream::patch_tfdt
          (ingest_stream *this,uint64_t time_anchor,bool applytimescale,uint32_t anchor_scale)

{
  uint32_t uVar1;
  long lVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  long lVar4;
  int iVar5;
  
  if (((int)CONCAT71(in_register_00000011,applytimescale) != 0) &&
     (uVar1 = init_fragment::get_time_scale(&this->init_fragment_), uVar1 != 0)) {
    time_anchor = (uVar1 * time_anchor) / (ulong)anchor_scale;
  }
  lVar4 = *(long *)&this->media_fragment_;
  lVar2 = *(long *)&this->field_0xd8;
  uVar3 = 0;
  iVar5 = 0;
  if (lVar2 != lVar4 && !applytimescale) {
    iVar5 = *(int *)(lVar2 + -0x1a4) + 1;
  }
  for (; (ulong)uVar3 < (ulong)((lVar2 - lVar4) / 1000); uVar3 = uVar3 + 1) {
    media_fragment::patch_tfdt
              ((media_fragment *)(lVar4 + (ulong)uVar3 * 1000),time_anchor,iVar5 + uVar3);
    lVar4 = *(long *)&this->media_fragment_;
    lVar2 = *(long *)&this->field_0xd8;
  }
  return;
}

Assistant:

void ingest_stream::patch_tfdt(uint64_t time_anchor, bool applytimescale, uint32_t anchor_scale)
	{
		if (applytimescale) {
			uint32_t timescale = 0;
			timescale = this->init_fragment_.get_time_scale();
			if(timescale)
			   time_anchor = time_anchor * timescale / anchor_scale; // offset to add to the timestamps
		}

		uint32_t seq_nr = 0;
		
		// only patch sequence number in the case when no timescale is applied 
		if (media_fragment_.size() && !applytimescale)
			seq_nr = 1 + this->media_fragment_[media_fragment_.size()-1].mfhd_.seq_nr_;

		for (uint32_t i = 0; i < this->media_fragment_.size(); i++)
		{
				this->media_fragment_[i].patch_tfdt(time_anchor, seq_nr + i);
		}	
	}